

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O0

int writeMPS_sparse(char *filename,int *numRow,int *numCol,int *objSense,double *objOffset,
                   vector<int,_std::allocator<int>_> *Astart,
                   vector<int,_std::allocator<int>_> *Aindex,
                   vector<double,_std::allocator<double>_> *Avalue,
                   vector<double,_std::allocator<double>_> *rhs,
                   vector<double,_std::allocator<double>_> *cost,
                   vector<double,_std::allocator<double>_> *lb,
                   vector<double,_std::allocator<double>_> *ub,
                   vector<int,_std::allocator<int>_> *integerColumn)

{
  value_type vVar1;
  int iVar2;
  reference pvVar3;
  uint *in_RDX;
  double *unaff_RBX;
  uint *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int *unaff_retaddr;
  int *in_stack_00000008;
  int *in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_00000018;
  vector<double,_std::allocator<double>_> *in_stack_00000020;
  vector<double,_std::allocator<double>_> *in_stack_00000028;
  vector<double,_std::allocator<double>_> *in_stack_00000030;
  vector<double,_std::allocator<double>_> *in_stack_00000038;
  vector<double,_std::allocator<double>_> *in_stack_00000040;
  vector<double,_std::allocator<double>_> *in_stack_00000048;
  vector<double,_std::allocator<double>_> *in_stack_00000050;
  vector<double,_std::allocator<double>_> *in_stack_00000058;
  vector<double,_std::allocator<double>_> *in_stack_00000060;
  vector<int,_std::allocator<int>_> *in_stack_00000068;
  int rtCd;
  int r_n;
  int c_n;
  vector<double,_std::allocator<double>_> rowUpper;
  vector<double,_std::allocator<double>_> rowLower;
  vector<double,_std::allocator<double>_> colUpper;
  vector<double,_std::allocator<double>_> colLower;
  vector<double,_std::allocator<double>_> colCost;
  vector<double,_std::allocator<double>_> *this;
  size_type in_stack_fffffffffffffed8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffee0;
  int local_c4;
  int local_c0;
  vector<double,_std::allocator<double>_> local_b0;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_80;
  vector<double,_std::allocator<double>_> local_68;
  vector<double,_std::allocator<double>_> local_50 [2];
  uint *local_20;
  uint *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c848d);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c849a);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c84a7);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c84b4);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c84c1);
  printf("writeMPS_sparse: Model has %d rows, %d columns and  nonzeros\n",(ulong)*local_18,
         (ulong)*local_20);
  std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  for (local_c0 = 0; local_c0 < (int)*local_20; local_c0 = local_c0 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_00000020,(long)local_c0);
    vVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_50,(long)local_c0);
    *pvVar3 = vVar1;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_00000028,(long)local_c0);
    vVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_68,(long)local_c0);
    *pvVar3 = vVar1;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_00000030,(long)local_c0);
    vVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_80,(long)local_c0);
    *pvVar3 = vVar1;
  }
  for (local_c4 = 0; local_c4 < (int)*local_18; local_c4 = local_c4 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_00000018,(long)local_c4);
    vVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_98,(long)local_c4);
    *pvVar3 = vVar1;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_00000018,(long)local_c4);
    vVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_b0,(long)local_c4);
    *pvVar3 = vVar1;
  }
  this = &local_68;
  iVar2 = writeMPS((char *)in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                   unaff_RBX,in_RDI,(vector<int,_std::allocator<int>_> *)in_stack_00000030,
                   in_stack_00000038,in_stack_00000040,in_stack_00000048,in_stack_00000050,
                   in_stack_00000058,in_stack_00000060,in_stack_00000068);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  return iVar2;
}

Assistant:

int writeMPS_sparse(const char *filename, int& numRow, int& numCol, int& objSense, double& objOffset,
		    vector<int>& Astart, vector<int>& Aindex, vector<double>& Avalue,
		    vector<double>& rhs, vector<double>& cost, vector<double>& lb, vector<double>& ub,
		    vector<int>& integerColumn) {
  vector<double> colCost;
  vector<double> colLower;
  vector<double> colUpper;
  vector<double> rowLower;
  vector<double> rowUpper;

#ifdef JAJH_dev
  printf("writeMPS_sparse: Model has %d rows, %d columns and  nonzeros\n", numRow, numCol);//, Astart[numCol]);
  cout<<flush;
#endif
  colCost.resize(numCol);
  colLower.resize(numCol);
  colUpper.resize(numCol);
  rowLower.resize(numRow);
  rowUpper.resize(numRow);

  for (int c_n = 0; c_n<numCol; c_n++) {
    colCost[c_n] = cost[c_n];
    colLower[c_n] = lb[c_n];
    colUpper[c_n] = ub[c_n];
  }
  for (int r_n = 0; r_n<numRow; r_n++) {
    rowLower[r_n] = rhs[r_n];
    rowUpper[r_n] = rhs[r_n];
  }  
  int rtCd = writeMPS(filename, numRow, numCol, objSense, objOffset,
		      Astart,  Aindex, Avalue,
		      colCost, colLower, colUpper,
		      rowLower, rowUpper,
		      integerColumn);
  return rtCd;
}